

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O1

SNode * goto_PNode(Parser *p,d_loc_t *loc,PNode *pn,SNode *ps)

{
  uint32 *puVar1;
  long lVar2;
  uint uVar3;
  PNode *pn_00;
  D_Reduction *reduction;
  ZNode *z;
  SNode **ppSVar4;
  SNode **ppSVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  long lVar8;
  SNode *pSVar9;
  ZNode *z_00;
  D_State *pDVar10;
  SNode *pSVar11;
  Reduction *pRVar12;
  SNode *extraout_RAX;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  D_RightEpsilonHint *pDVar16;
  long lVar17;
  uint uVar18;
  bool bVar19;
  
  uVar3 = (pn->parse_node).symbol;
  pSVar9 = (SNode *)(long)(int)uVar3;
  uVar18 = uVar3 + 7;
  if (-1 < (long)pSVar9) {
    uVar18 = uVar3;
  }
  if ((ps->state->goto_valid[(int)uVar18 >> 3] >> (uVar3 & 7) & 1) == 0) {
    return pSVar9;
  }
  pSVar9 = add_SNode(p,p->t->state +
                       (p->t->goto_table[(long)pSVar9 - (long)ps->state->goto_table_offset] - 1),loc
                     ,(pn->parse_node).scope);
  pn_00 = pSVar9->last_pn;
  if (pn_00 != (PNode *)0x0) {
    puVar1 = &pn_00->refcount;
    *puVar1 = *puVar1 - 1;
    if (*puVar1 == 0) {
      free_PNode(p,pn_00);
    }
  }
  pn->refcount = pn->refcount + 1;
  pSVar9->last_pn = pn;
  if (pSVar9 != ps) {
    if ((*(uint *)&pSVar9->field_0x24 & 0x7fffffff) <= (*(uint *)&ps->field_0x24 & 0x7fffffff)) {
      *(uint *)&pSVar9->field_0x24 =
           *(uint *)&pSVar9->field_0x24 & 0x80000000 | *(uint *)&ps->field_0x24 + 1 & 0x7fffffff;
    }
  }
  uVar3 = (pSVar9->zns).n;
  uVar15 = CONCAT44(0,uVar3);
  if (uVar15 < 4) {
    if (uVar15 != 0) {
      uVar14 = 0;
      do {
        z_00 = (pSVar9->zns).v[uVar14];
        if (z_00->pn == pn) goto LAB_001465c0;
        uVar14 = uVar14 + 1;
      } while (uVar15 != uVar14);
    }
LAB_00146572:
    z_00 = (ZNode *)0x0;
  }
  else {
    auVar6._8_8_ = 0;
    auVar6._0_8_ = uVar15;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = pn;
    uVar15 = SUB168(auVar7 % auVar6,0);
    z_00 = (ZNode *)0x0;
    if (SUB164(auVar7 % auVar6,0) < uVar3) {
      uVar18 = 0;
      do {
        z_00 = (pSVar9->zns).v[uVar15];
        if (z_00 == (ZNode *)0x0) goto LAB_00146572;
        if (z_00->pn == pn) break;
        uVar13 = (int)uVar15 + 1;
        uVar15 = (ulong)uVar13;
        if (uVar13 == uVar3) {
          uVar15 = 0;
        }
        if (uVar3 <= (uint)uVar15) goto LAB_00146572;
        z_00 = (ZNode *)0x0;
        bVar19 = uVar18 < 4;
        uVar18 = uVar18 + 1;
      } while (bVar19);
    }
  }
LAB_001465c0:
  if (z_00 == (ZNode *)0x0) {
    z_00 = new_ZNode(p,pn);
    set_add_znode(&pSVar9->zns,z_00);
    pDVar10 = pSVar9->state;
    if ((pDVar10->reductions).n != 0) {
      uVar15 = 0;
      do {
        reduction = (pDVar10->reductions).v[uVar15];
        if (reduction->nelements != 0) {
          add_Reduction(p,z_00,pSVar9,reduction);
        }
        uVar15 = uVar15 + 1;
        pDVar10 = pSVar9->state;
      } while (uVar15 < (pDVar10->reductions).n);
    }
    if ((pn->shift == (D_Shift *)0x0) &&
       (pDVar10 = pSVar9->state, (pDVar10->right_epsilon_hints).n != 0)) {
      uVar15 = 0;
      do {
        pDVar16 = (pDVar10->right_epsilon_hints).v;
        pSVar11 = find_SNode(p,(uint)pDVar16[uVar15].preceeding_state,pSVar9->initial_scope);
        if ((pSVar11 != (SNode *)0x0) && ((pSVar11->zns).n != 0)) {
          pDVar16 = pDVar16 + uVar15;
          uVar14 = 0;
          do {
            z = (pSVar11->zns).v[uVar14];
            if ((z != (ZNode *)0x0) &&
               (pRVar12 = add_Reduction(p,z,pSVar11,(D_Reduction *)pDVar16->reduction),
               pRVar12 != (Reduction *)0x0)) {
              pRVar12->new_snode = pSVar9;
              pRVar12->new_depth = (uint)pDVar16->depth;
            }
            uVar14 = uVar14 + 1;
          } while (uVar14 < (pSVar11->zns).n);
        }
        uVar15 = uVar15 + 1;
        pDVar10 = pSVar9->state;
      } while (uVar15 < (pDVar10->right_epsilon_hints).n);
    }
  }
  uVar3 = (z_00->sns).n;
  pSVar11 = (SNode *)(ulong)uVar3;
  bVar19 = pSVar11 != (SNode *)0x0;
  if (bVar19) {
    ppSVar4 = (z_00->sns).v;
    if (*ppSVar4 != ps) {
      lVar17 = 0;
      do {
        if (uVar3 - 1 == (int)lVar17) goto LAB_00146716;
        lVar2 = lVar17 + 1;
        lVar8 = lVar17 + 1;
        lVar17 = lVar2;
      } while (ppSVar4[lVar8] != ps);
      bVar19 = (uint)lVar2 < uVar3;
    }
    if (bVar19) {
      return pSVar11;
    }
  }
LAB_00146716:
  ppSVar5 = (z_00->sns).v;
  ppSVar4 = (z_00->sns).e;
  if (ppSVar5 == (SNode **)0x0) {
    (z_00->sns).v = ppSVar4;
    (z_00->sns).n = uVar3 + 1;
    (z_00->sns).e[(long)pSVar11] = ps;
    goto LAB_00146763;
  }
  if (ppSVar5 == ppSVar4) {
    if (2 < uVar3) goto LAB_00146758;
  }
  else if ((uVar3 & 7) == 0) {
LAB_00146758:
    vec_add_internal(&z_00->sns,ps);
    pSVar11 = extraout_RAX;
    goto LAB_00146763;
  }
  (z_00->sns).n = uVar3 + 1;
  ppSVar5[(long)pSVar11] = ps;
LAB_00146763:
  if (pSVar9 != ps) {
    ps->refcount = ps->refcount + 1;
  }
  return pSVar11;
}

Assistant:

static SNode *goto_PNode(Parser *p, d_loc_t *loc, PNode *pn, SNode *ps) {
  SNode *new_ps, *pre_ps;
  ZNode *z = NULL;
  D_State *state;
  uint i, j, k, state_index;

  if (!IS_BIT_SET(ps->state->goto_valid, pn->parse_node.symbol)) return NULL;
  state_index = GOTO_STATE(p, pn, ps);
  state = &p->t->state[state_index];
  new_ps = add_SNode(p, state, loc, pn->parse_node.scope);
  if (new_ps->last_pn) unref_pn(p, new_ps->last_pn);
  ref_pn(pn);
  new_ps->last_pn = pn;

  DBG(printf("goto %d (%s) -> %d %p\n", (int)(ps->state - p->t->state), p->t->symbols[pn->parse_node.symbol].name,
             state_index, (void *)new_ps));
  if (ps != new_ps && new_ps->depth < ps->depth + 1) new_ps->depth = ps->depth + 1;
  /* find/create ZNode */
  z = set_find_znode(&new_ps->zns, pn);
  if (!z) { /* not found */
    set_add_znode(&new_ps->zns, (z = new_ZNode(p, pn)));
    for (j = 0; j < new_ps->state->reductions.n; j++)
      if (new_ps->state->reductions.v[j]->nelements) add_Reduction(p, z, new_ps, new_ps->state->reductions.v[j]);
    if (!pn->shift)
      for (j = 0; j < new_ps->state->right_epsilon_hints.n; j++) {
        D_RightEpsilonHint *h = &new_ps->state->right_epsilon_hints.v[j];
        pre_ps = find_SNode(p, h->preceeding_state, new_ps->initial_scope);
        if (!pre_ps) continue;
        for (k = 0; k < pre_ps->zns.n; k++)
          if (pre_ps->zns.v[k]) {
            Reduction *r = add_Reduction(p, pre_ps->zns.v[k], pre_ps, h->reduction);
            if (r) {
              r->new_snode = new_ps;
              r->new_depth = h->depth;
            }
          }
      }
  }
  for (i = 0; i < z->sns.n; i++)
    if (z->sns.v[i] == ps) break;
  if (i >= z->sns.n) { /* not found */
    vec_add(&z->sns, ps);
    if (new_ps != ps) ref_sn(ps);
  }
  return new_ps;
}